

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_RF5C_Mem(VGMPlayer *this)

{
  ushort uVar1;
  CHIP_DEVICE *pCVar2;
  DEVFUNC_WRITE_A16D8 UNRECOVERED_JUMPTABLE;
  UINT8 *pUVar3;
  ulong uVar4;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  if ((pCVar2 != (CHIP_DEVICE *)0x0) &&
     (UNRECOVERED_JUMPTABLE = pCVar2->writeM8, UNRECOVERED_JUMPTABLE != (DEVFUNC_WRITE_A16D8)0x0)) {
    pUVar3 = this->_fileData;
    uVar4 = (ulong)this->_filePos;
    uVar1 = *(ushort *)(pUVar3 + uVar4 + 1);
    if (0xfff < uVar1) {
      emu_logf(&this->_logger,'\x02',"RF5C mem write to out-of-window offset 0x%04X\n",
               (ulong)(uint)uVar1);
      UNRECOVERED_JUMPTABLE = pCVar2->writeM8;
      pUVar3 = this->_fileData;
      uVar4 = (ulong)this->_filePos;
    }
    (*UNRECOVERED_JUMPTABLE)((pCVar2->base).defInf.dataPtr,uVar1,pUVar3[uVar4 + 3]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_RF5C_Mem(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeM8 == NULL)
		return;
	
	UINT16 memOfs = ReadLE16(&fData[0x01]);
	if (memOfs & 0xF000)
		emu_logf(&_logger, PLRLOG_WARN, "RF5C mem write to out-of-window offset 0x%04X\n", memOfs);
	cDev->writeM8(cDev->base.defInf.dataPtr, memOfs, fData[0x03]);
	return;
}